

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

void __thiscall tcmalloc::PageHeap::CommitSpan(PageHeap *this,Span *span)

{
  Span *span_local;
  PageHeap *this_local;
  
  (this->stats_).commit_count = (this->stats_).commit_count + 1;
  TCMalloc_SystemCommit((void *)(span->start << 0xd),span->length << 0xd);
  (this->stats_).committed_bytes = span->length * 0x2000 + (this->stats_).committed_bytes;
  (this->stats_).total_commit_bytes = span->length * 0x2000 + (this->stats_).total_commit_bytes;
  return;
}

Assistant:

void PageHeap::CommitSpan(Span* span) {
  ++stats_.commit_count;

  TCMalloc_SystemCommit(reinterpret_cast<void*>(span->start << kPageShift),
                        static_cast<size_t>(span->length << kPageShift));
  stats_.committed_bytes += span->length << kPageShift;
  stats_.total_commit_bytes += (span->length << kPageShift);
}